

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralProduct.h
# Opt level: O3

void __thiscall
Eigen::
GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>,Eigen::Transpose<Eigen::Matrix<double,-1,1,0,-1,1>>,2>
::set::operator()(void *this,Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *dst,
                 CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 *src)

{
  ulong uVar1;
  Nested pMVar2;
  PointerType pdVar3;
  double *pdVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  Index size;
  Index index_1;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  
  uVar1 = (dst->super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
          ).super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
          m_rows.m_value;
  pMVar2 = (src->m_xpr).m_xpr;
  if (uVar1 == (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_rows) {
    pdVar3 = (dst->
             super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>).
             super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
             m_data;
    uVar8 = (ulong)((uint)((ulong)pdVar3 >> 3) & 1);
    if ((long)uVar1 <= (long)uVar8) {
      uVar8 = uVar1;
    }
    if (((ulong)pdVar3 & 7) != 0) {
      uVar8 = uVar1;
    }
    lVar9 = uVar1 - uVar8;
    if (0 < (long)uVar8) {
      pdVar4 = (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data;
      uVar10 = 0;
      do {
        pdVar3[uVar10] = pdVar4[uVar10] * (src->m_xpr).m_functor.m_other * (src->m_functor).m_other;
        uVar10 = uVar10 + 1;
      } while (uVar8 != uVar10);
    }
    uVar10 = (lVar9 - (lVar9 >> 0x3f) & 0xfffffffffffffffeU) + uVar8;
    if (1 < lVar9) {
      do {
        pdVar4 = (((src->m_xpr).m_xpr)->
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data +
                 uVar8;
        dVar5 = pdVar4[1];
        dVar6 = (src->m_xpr).m_functor.m_other;
        dVar7 = (src->m_functor).m_other;
        pdVar3 = (dst->
                 super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                 ).
                 super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                 .m_data + uVar8;
        *pdVar3 = dVar7 * dVar6 * *pdVar4;
        pdVar3[1] = dVar7 * dVar6 * dVar5;
        uVar8 = uVar8 + 2;
      } while ((long)uVar8 < (long)uVar10);
    }
    if ((long)uVar10 < (long)uVar1) {
      pdVar4 = (((src->m_xpr).m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
               ).m_storage.m_data;
      pdVar3 = (dst->
               super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>)
               .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
               super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
               .
               super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
               .m_data;
      do {
        pdVar3[uVar10] = pdVar4[uVar10] * (src->m_xpr).m_functor.m_other * (src->m_functor).m_other;
        uVar10 = uVar10 + 1;
      } while (uVar1 != uVar10);
    }
    return;
  }
  __assert_fail("rows() == other.rows() && cols() == other.cols()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/preritj[P]Unscented-Kalman-Filter/src/Eigen/src/Core/Assign.h"
                ,0x1f9,
                "Derived &Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, OtherDerived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Matrix<double, -1, 1>>>]"
               );
}

Assistant:

void operator()(const Dst& dst, const Src& src) const { dst.const_cast_derived() += src; }